

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O3

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string e;
  yyscan_t yyscanner;
  string local_1b0 [2];
  yyscan_t local_168 [13];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  if (str == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    this->Verbose = verb;
    pcVar2 = (char *)(this->InputBuffer)._M_string_length;
    strlen(str);
    std::__cxx11::string::_M_replace((ulong)&this->InputBuffer,0,pcVar2,(ulong)str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(local_168);
    cmExpr_yyset_extra((cmCTestResourceGroupsLexerHelper *)this,local_168[0]);
    iVar3 = cmExpr_yyparse(local_168[0]);
    if (iVar3 != 0) {
      local_a8.first._M_len = 0x1e;
      local_a8.first._M_str = "cannot parse the expression: \"";
      local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_88 = (this->InputBuffer)._M_dataplus._M_p;
      local_90 = (this->InputBuffer)._M_string_length;
      local_80 = 0;
      local_78 = 3;
      local_70 = "\": ";
      local_68 = 0;
      local_58 = (this->ErrorString)._M_dataplus._M_p;
      local_60 = (this->ErrorString)._M_string_length;
      local_50 = 0;
      local_d0 = local_c8;
      local_e0 = 0;
      local_d8 = 1;
      local_c8[0] = 0x2e;
      local_48 = 1;
      local_38 = 0;
      views._M_len = 5;
      views._M_array = &local_a8;
      local_40 = local_d0;
      cmCatViews(local_1b0,views);
      paVar1 = &local_1b0[0].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p == paVar1) {
        local_f0._8_8_ = local_1b0[0].field_2._8_8_;
        local_100 = &local_f0;
      }
      else {
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0[0]._M_dataplus._M_p;
      }
      local_f0._M_allocated_capacity._1_7_ = local_1b0[0].field_2._M_allocated_capacity._1_7_;
      local_f0._M_local_buf[0] = local_1b0[0].field_2._M_local_buf[0];
      local_f8 = local_1b0[0]._M_string_length;
      local_1b0[0]._M_string_length = 0;
      local_1b0[0].field_2._M_local_buf[0] = '\0';
      local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::operator=((string *)&this->ErrorString,(string *)&local_100);
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0[0]._M_dataplus._M_p,
                        CONCAT71(local_1b0[0].field_2._M_allocated_capacity._1_7_,
                                 local_1b0[0].field_2._M_local_buf[0]) + 1);
      }
    }
    cmExpr_yylex_destroy(local_168[0]);
    iVar3 = 0;
    if (((this->ErrorString)._M_string_length == 0) && (iVar3 = 1, this->Verbose != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expanding [",0xb);
      sVar4 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] produced: [",0xd);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return iVar3;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);

  try {
    int res = cmExpr_yyparse(yyscanner);
    if (res != 0) {
      std::string e =
        cmStrCat("cannot parse the expression: \"", this->InputBuffer,
                 "\": ", this->ErrorString, '.');
      this->SetError(std::move(e));
    }
  } catch (std::runtime_error const& fail) {
    std::string e = cmStrCat("cannot evaluate the expression: \"",
                             this->InputBuffer, "\": ", fail.what(), '.');
    this->SetError(std::move(e));
  } catch (std::out_of_range const&) {
    std::string e = "cannot evaluate the expression: \"" + this->InputBuffer +
      "\": a numeric value is out of range.";
    this->SetError(std::move(e));
  } catch (...) {
    std::string e =
      "cannot parse the expression: \"" + this->InputBuffer + "\".";
    this->SetError(std::move(e));
  }
  cmExpr_yylex_destroy(yyscanner);
  if (!this->ErrorString.empty()) {
    return 0;
  }

  if (this->Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}